

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::format_data_string
                   (string *__return_storage_ptr__,string *data,string *mask,uint64_t flags)

{
  size_type sVar1;
  size_type sVar2;
  logic_error *this;
  phosg *this_00;
  void *vdata;
  uint64_t in_R9;
  char *local_70;
  uint64_t flags_local;
  string *mask_local;
  string *data_local;
  
  if (mask != (string *)0x0) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (mask);
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (data);
    if (sVar1 != sVar2) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      ::std::logic_error::logic_error(this,"data and mask sizes do not match");
      __cxa_throw(this,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
    }
  }
  this_00 = (phosg *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            data);
  vdata = (void *)::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::size(data);
  if (mask == (string *)0x0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mask)
    ;
  }
  format_data_string_abi_cxx11_
            (__return_storage_ptr__,this_00,vdata,(size_t)local_70,(void *)flags,in_R9);
  return __return_storage_ptr__;
}

Assistant:

string format_data_string(const string& data, const string* mask, uint64_t flags) {
  if (mask && (mask->size() != data.size())) {
    throw logic_error("data and mask sizes do not match");
  }
  return format_data_string(data.data(), data.size(), mask ? mask->data() : nullptr, flags);
}